

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgallocator.c
# Opt level: O0

mg_linear_allocator *
mg_linear_allocator_init(mg_allocator *allocator,size_t block_size,size_t sep_alloc_threshold)

{
  mg_memory_block *pmVar1;
  mg_linear_allocator *alloc;
  mg_linear_allocator tmp_alloc;
  mg_memory_block *first_block;
  void *in_stack_ffffffffffffff88;
  mg_allocator *in_stack_ffffffffffffff90;
  mg_allocator *in_stack_ffffffffffffff98;
  mg_linear_allocator *local_8;
  
  pmVar1 = mg_memory_block_alloc(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  if (pmVar1 == (mg_memory_block *)0x0) {
    local_8 = (mg_linear_allocator *)0x0;
  }
  else {
    local_8 = (mg_linear_allocator *)
              mg_allocator_malloc(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    if (local_8 == (mg_linear_allocator *)0x0) {
      mg_allocator_free((mg_allocator *)0x0,in_stack_ffffffffffffff88);
      local_8 = (mg_linear_allocator *)0x0;
    }
    else {
      memcpy(local_8,&stack0xffffffffffffff98,0x40);
    }
  }
  return local_8;
}

Assistant:

mg_linear_allocator *mg_linear_allocator_init(mg_allocator *allocator,
                                              size_t block_size,
                                              size_t sep_alloc_threshold) {
  mg_memory_block *first_block = mg_memory_block_alloc(allocator, block_size);
  if (!first_block) {
    return NULL;
  }

  mg_linear_allocator tmp_alloc = {mg_linear_allocator_malloc,
                                   mg_linear_allocator_realloc,
                                   mg_linear_allocator_free,
                                   first_block,
                                   0,
                                   block_size,
                                   sep_alloc_threshold,
                                   allocator};
  mg_linear_allocator *alloc =
      mg_allocator_malloc(allocator, sizeof(mg_linear_allocator));
  if (!alloc) {
    mg_allocator_free(allocator, first_block);
    return NULL;
  }

  memcpy(alloc, &tmp_alloc, sizeof(mg_linear_allocator));
  return alloc;
}